

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope
          (FunctionScope *this,Function *function,Literals *arguments,ModuleRunner *parent)

{
  size_t *psVar1;
  pointer *ppNVar2;
  iterator __position;
  pointer pLVar3;
  char cVar4;
  char *pcVar5;
  size_type __new_size;
  element_type *peVar6;
  Type TVar7;
  uintptr_t *puVar8;
  ostream *poVar9;
  char *pcVar10;
  Literal *this_00;
  element_type *peVar11;
  long lVar12;
  long lVar13;
  Name name;
  Name name_00;
  initializer_list<wasm::Literal> init;
  Literal local_a8;
  SmallVector<wasm::Literal,_1UL> local_90;
  undefined8 local_58;
  Type params;
  
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->function = function;
  this->parent = parent;
  (this->currDelegateTarget).super_IString.str._M_len = 0;
  (this->currDelegateTarget).super_IString.str._M_str = (char *)0x0;
  this->oldScope = (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).scope;
  (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).scope = this;
  psVar1 = &(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).callDepth;
  *psVar1 = *psVar1 + 1;
  __position._M_current =
       (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
       super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)
               &(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack,__position,
               (Name *)function);
  }
  else {
    pcVar5 = (function->super_Importable).super_Named.name.super_IString.str._M_str;
    ((__position._M_current)->super_IString).str._M_len =
         (function->super_Importable).super_Named.name.super_IString.str._M_len;
    ((__position._M_current)->super_IString).str._M_str = pcVar5;
    ppNVar2 = &(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
               super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar2 = *ppNVar2 + 1;
  }
  local_90.usedFixed = wasm::HeapType::getSignature();
  pcVar5 = (char *)Type::size((Type *)&local_90);
  pcVar10 = (char *)(((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                    (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed);
  if (pcVar5 != pcVar10) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Function `",10);
    name_00.super_IString.str._M_str = pcVar10;
    name_00.super_IString.str._M_len =
         (size_t)(function->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar9 = wasm::operator<<((wasm *)&std::cerr,
                              (ostream *)
                              (function->super_Importable).super_Named.name.super_IString.str._M_len
                              ,name_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"` expects ",10);
    local_90.usedFixed = wasm::HeapType::getSignature();
    Type::size((Type *)&local_90);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," parameters, got ",0x11);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," arguments.",0xb);
    std::endl<char,std::char_traits<char>>(poVar9);
    wasm::handle_unreachable
              ("invalid param count",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xc8b);
  }
  __new_size = wasm::Function::getNumLocals();
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::resize(&this->locals,__new_size);
  local_58 = wasm::HeapType::getSignature();
  params.id = (uintptr_t)&(arguments->super_SmallVector<wasm::Literal,_1UL>).fixed;
  lVar12 = -0x18;
  lVar13 = 0;
  peVar11 = (element_type *)0x0;
  do {
    peVar6 = (element_type *)wasm::Function::getNumLocals();
    if (peVar6 <= peVar11) {
      return;
    }
    pLVar3 = (arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
    peVar6 = (element_type *)
             (((long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pLVar3 >> 3) * -0x5555555555555555 +
             (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed);
    if (peVar11 < peVar6) {
      TVar7.id = (uintptr_t)((pLVar3->field_0).v128 + lVar12);
      if (peVar11 == (element_type *)0x0) {
        TVar7 = params;
      }
      TVar7.id = *(uintptr_t *)(TVar7.id + 0x10);
      local_90.usedFixed = (size_t)&local_58;
      local_90.fixed._M_elems[0].field_0.exnData.
      super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)peVar11
      ;
      puVar8 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)&local_90);
      cVar4 = wasm::Type::isSubType(TVar7,(Type)*puVar8);
      if (cVar4 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Function `",10);
        name.super_IString.str._M_str = (char *)peVar6;
        name.super_IString.str._M_len =
             (size_t)(function->super_Importable).super_Named.name.super_IString.str._M_str;
        poVar9 = wasm::operator<<((wasm *)&std::cerr,
                                  (ostream *)
                                  (function->super_Importable).super_Named.name.super_IString.str.
                                  _M_len,name);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"` expects type ",0xf);
        local_90.usedFixed = (size_t)&local_58;
        local_90.fixed._M_elems[0].field_0.exnData.
        super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)peVar11;
        puVar8 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)&local_90);
        poVar9 = (ostream *)wasm::operator<<(poVar9,(Type)*puVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," for parameter ",0xf);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", got ",6);
        TVar7.id = (uintptr_t)
                   ((((arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start)->field_0).v128 + lVar12);
        if (peVar11 == (element_type *)0x0) {
          TVar7 = params;
        }
        poVar9 = (ostream *)wasm::operator<<(poVar9,(Type)*(uintptr_t *)(TVar7.id + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
        std::endl<char,std::char_traits<char>>(poVar9);
        wasm::handle_unreachable
                  ("invalid param count",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xc95);
      }
      TVar7.id = (uintptr_t)
                 ((long)&((arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start)->field_0 + lVar12);
      if (peVar11 == (element_type *)0x0) {
        TVar7 = params;
      }
      wasm::Literal::Literal(&local_a8,(Literal *)TVar7.id);
      init._M_len = 1;
      init._M_array = &local_a8;
      Literals::Literals((Literals *)&local_90,init);
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)
                 ((long)&(((this->locals).
                           super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_SmallVector<wasm::Literal,_1UL>).fixed + lVar13 + 0xfffffffffffffff8U
                 ),&local_90);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_90.flexible);
      wasm::Literal::~Literal(local_90.fixed._M_elems);
      this_00 = &local_a8;
    }
    else {
      cVar4 = wasm::Function::isVar((uint)function);
      if (cVar4 == '\0') {
        __assert_fail("function->isVar(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0xc99,
                      "wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope(Function *, const Literals &, SubType &) [SubType = wasm::ModuleRunner]"
                     );
      }
      wasm::Function::getLocalType((uint)function);
      wasm::Literal::makeZeros((Type)&local_90);
      SmallVector<wasm::Literal,_1UL>::operator=
                ((SmallVector<wasm::Literal,_1UL> *)
                 ((long)&(((this->locals).
                           super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_SmallVector<wasm::Literal,_1UL>).fixed + lVar13 + 0xfffffffffffffff8U
                 ),&local_90);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_90.flexible);
      this_00 = local_90.fixed._M_elems;
    }
    wasm::Literal::~Literal(this_00);
    peVar11 = (element_type *)((long)&(peVar11->type).id + 1);
    lVar12 = lVar12 + 0x18;
    lVar13 = lVar13 + 0x38;
  } while( true );
}

Assistant:

FunctionScope(Function* function,
                  const Literals& arguments,
                  SubType& parent)
      : function(function), parent(parent) {
      oldScope = parent.scope;
      parent.scope = this;
      parent.callDepth++;
      parent.functionStack.push_back(function->name);

      if (function->getParams().size() != arguments.size()) {
        std::cerr << "Function `" << function->name << "` expects "
                  << function->getParams().size() << " parameters, got "
                  << arguments.size() << " arguments." << std::endl;
        WASM_UNREACHABLE("invalid param count");
      }
      locals.resize(function->getNumLocals());
      Type params = function->getParams();
      for (size_t i = 0; i < function->getNumLocals(); i++) {
        if (i < arguments.size()) {
          if (!Type::isSubType(arguments[i].type, params[i])) {
            std::cerr << "Function `" << function->name << "` expects type "
                      << params[i] << " for parameter " << i << ", got "
                      << arguments[i].type << "." << std::endl;
            WASM_UNREACHABLE("invalid param count");
          }
          locals[i] = {arguments[i]};
        } else {
          assert(function->isVar(i));
          locals[i] = Literal::makeZeros(function->getLocalType(i));
        }
      }
    }